

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O2

int Mvc_CoverFirstCubeFirstLit(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  pMVar1 = Mvc_CoverReadCubeHead(pCover);
  uVar4 = pCover->nBits;
  uVar3 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  for (; (uVar2 = 0xffffffff, uVar4 != uVar3 &&
         (uVar2 = uVar3, (pMVar1->pData[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) == 0)); uVar3 = uVar3 + 1
      ) {
  }
  return uVar2;
}

Assistant:

int Mvc_CoverFirstCubeFirstLit( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Value;

    // get the first cube
    pCube = Mvc_CoverReadCubeHead( pCover );
    // get the first literal
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
        if ( Value )
            return iBit;
    return -1;
}